

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall google::protobuf::FileOptions::FileOptions(FileOptions *this,FileOptions *from)

{
  bool bVar1;
  InternalMetadataWithArena *this_00;
  string *psVar2;
  string *this_01;
  FileOptions *this_02;
  Arena *arena;
  FileOptions *in_RSI;
  undefined8 *in_RDI;
  Arena *in_stack_fffffffffffffd28;
  FileOptions *in_stack_fffffffffffffd30;
  string *in_stack_fffffffffffffd38;
  RepeatedPtrField<google::protobuf::UninterpretedOption> *in_stack_fffffffffffffd40;
  ExtensionSet *in_stack_fffffffffffffd78;
  undefined7 in_stack_fffffffffffffd80;
  undefined1 in_stack_fffffffffffffd87;
  ExtensionSet *in_stack_fffffffffffffd90;
  
  Message::Message(&in_stack_fffffffffffffd30->super_Message);
  *in_RDI = &PTR__FileOptions_008d8c80;
  internal::ExtensionSet::ExtensionSet(in_stack_fffffffffffffd90);
  internal::InternalMetadataWithArena::InternalMetadataWithArena
            ((InternalMetadataWithArena *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  *(uint32 *)(in_RDI + 5) = (in_RSI->_has_bits_).has_bits_[0];
  internal::CachedSize::CachedSize((CachedSize *)0x50599f);
  RepeatedPtrField<google::protobuf::UninterpretedOption>::RepeatedPtrField
            (in_stack_fffffffffffffd40,
             (RepeatedPtrField<google::protobuf::UninterpretedOption> *)in_stack_fffffffffffffd38);
  this_00 = &in_RSI->_internal_metadata_;
  if (((uint)(this_00->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    if (((uint)(this_00->
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ).ptr_ & 1) == 1) {
      internal::
      InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
      ::
      PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                  *)this_00);
    }
    else {
      internal::InternalMetadataWithArena::default_instance();
    }
    internal::InternalMetadataWithArena::DoMergeFrom
              ((InternalMetadataWithArena *)in_stack_fffffffffffffd30,
               (UnknownFieldSet *)in_stack_fffffffffffffd28);
  }
  internal::ExtensionSet::MergeFrom
            ((ExtensionSet *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
             in_stack_fffffffffffffd78);
  psVar2 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  internal::ArenaStringPtr::UnsafeSetDefault((ArenaStringPtr *)(in_RDI + 9),psVar2);
  bVar1 = _internal_has_java_package(in_RSI);
  if (bVar1) {
    internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    _internal_java_package_abi_cxx11_((FileOptions *)0x505ba6);
    GetArenaNoVirtual(in_stack_fffffffffffffd30);
    internal::ArenaStringPtr::Set
              ((ArenaStringPtr *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
               (string *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  }
  psVar2 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  internal::ArenaStringPtr::UnsafeSetDefault((ArenaStringPtr *)(in_RDI + 10),psVar2);
  bVar1 = _internal_has_java_outer_classname(in_RSI);
  if (bVar1) {
    internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    _internal_java_outer_classname_abi_cxx11_((FileOptions *)0x505cee);
    GetArenaNoVirtual(in_stack_fffffffffffffd30);
    internal::ArenaStringPtr::Set
              ((ArenaStringPtr *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
               (string *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  }
  psVar2 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  internal::ArenaStringPtr::UnsafeSetDefault((ArenaStringPtr *)(in_RDI + 0xb),psVar2);
  bVar1 = _internal_has_go_package(in_RSI);
  if (bVar1) {
    internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    _internal_go_package_abi_cxx11_((FileOptions *)0x505dc5);
    GetArenaNoVirtual(in_stack_fffffffffffffd30);
    internal::ArenaStringPtr::Set
              ((ArenaStringPtr *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
               (string *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  }
  psVar2 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  internal::ArenaStringPtr::UnsafeSetDefault((ArenaStringPtr *)(in_RDI + 0xc),psVar2);
  bVar1 = _internal_has_objc_class_prefix(in_RSI);
  if (bVar1) {
    internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    _internal_objc_class_prefix_abi_cxx11_((FileOptions *)0x505e9c);
    GetArenaNoVirtual(in_stack_fffffffffffffd30);
    internal::ArenaStringPtr::Set
              ((ArenaStringPtr *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
               (string *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  }
  psVar2 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  internal::ArenaStringPtr::UnsafeSetDefault((ArenaStringPtr *)(in_RDI + 0xd),psVar2);
  bVar1 = _internal_has_csharp_namespace(in_RSI);
  if (bVar1) {
    internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    _internal_csharp_namespace_abi_cxx11_((FileOptions *)0x505f73);
    GetArenaNoVirtual(in_stack_fffffffffffffd30);
    internal::ArenaStringPtr::Set
              ((ArenaStringPtr *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
               (string *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  }
  psVar2 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  internal::ArenaStringPtr::UnsafeSetDefault((ArenaStringPtr *)(in_RDI + 0xe),psVar2);
  bVar1 = _internal_has_swift_prefix(in_RSI);
  if (bVar1) {
    internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    _internal_swift_prefix_abi_cxx11_((FileOptions *)0x50604a);
    GetArenaNoVirtual(in_stack_fffffffffffffd30);
    internal::ArenaStringPtr::Set
              ((ArenaStringPtr *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
               (string *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  }
  psVar2 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  internal::ArenaStringPtr::UnsafeSetDefault((ArenaStringPtr *)(in_RDI + 0xf),psVar2);
  bVar1 = _internal_has_php_class_prefix(in_RSI);
  if (bVar1) {
    internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    _internal_php_class_prefix_abi_cxx11_((FileOptions *)0x506121);
    GetArenaNoVirtual(in_stack_fffffffffffffd30);
    internal::ArenaStringPtr::Set
              ((ArenaStringPtr *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
               (string *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  }
  psVar2 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  internal::ArenaStringPtr::UnsafeSetDefault((ArenaStringPtr *)(in_RDI + 0x10),psVar2);
  bVar1 = _internal_has_php_namespace(in_RSI);
  if (bVar1) {
    internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    _internal_php_namespace_abi_cxx11_((FileOptions *)0x5061f8);
    GetArenaNoVirtual(in_stack_fffffffffffffd30);
    internal::ArenaStringPtr::Set
              ((ArenaStringPtr *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
               (string *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  }
  psVar2 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  internal::ArenaStringPtr::UnsafeSetDefault((ArenaStringPtr *)(in_RDI + 0x11),psVar2);
  bVar1 = _internal_has_php_metadata_namespace(in_RSI);
  if (bVar1) {
    internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    _internal_php_metadata_namespace_abi_cxx11_((FileOptions *)0x5062af);
    GetArenaNoVirtual(in_stack_fffffffffffffd30);
    internal::ArenaStringPtr::Set
              ((ArenaStringPtr *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
               (string *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  }
  psVar2 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  internal::ArenaStringPtr::UnsafeSetDefault((ArenaStringPtr *)(in_RDI + 0x12),psVar2);
  bVar1 = _internal_has_ruby_package(in_RSI);
  if (bVar1) {
    psVar2 = (string *)(in_RDI + 0x12);
    this_01 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    this_02 = (FileOptions *)_internal_ruby_package_abi_cxx11_((FileOptions *)0x506360);
    arena = GetArenaNoVirtual(this_02);
    internal::ArenaStringPtr::Set((ArenaStringPtr *)this_01,psVar2,(string *)this_02,arena);
  }
  memcpy(in_RDI + 0x13,&in_RSI->java_multiple_files_,0x10);
  return;
}

Assistant:

FileOptions::FileOptions(const FileOptions& from)
  : ::PROTOBUF_NAMESPACE_ID::Message(),
      _internal_metadata_(nullptr),
      _has_bits_(from._has_bits_),
      uninterpreted_option_(from.uninterpreted_option_) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  _extensions_.MergeFrom(from._extensions_);
  java_package_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_java_package()) {
    java_package_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_java_package(),
      GetArenaNoVirtual());
  }
  java_outer_classname_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_java_outer_classname()) {
    java_outer_classname_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_java_outer_classname(),
      GetArenaNoVirtual());
  }
  go_package_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_go_package()) {
    go_package_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_go_package(),
      GetArenaNoVirtual());
  }
  objc_class_prefix_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_objc_class_prefix()) {
    objc_class_prefix_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_objc_class_prefix(),
      GetArenaNoVirtual());
  }
  csharp_namespace_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_csharp_namespace()) {
    csharp_namespace_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_csharp_namespace(),
      GetArenaNoVirtual());
  }
  swift_prefix_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_swift_prefix()) {
    swift_prefix_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_swift_prefix(),
      GetArenaNoVirtual());
  }
  php_class_prefix_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_php_class_prefix()) {
    php_class_prefix_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_php_class_prefix(),
      GetArenaNoVirtual());
  }
  php_namespace_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_php_namespace()) {
    php_namespace_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_php_namespace(),
      GetArenaNoVirtual());
  }
  php_metadata_namespace_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_php_metadata_namespace()) {
    php_metadata_namespace_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_php_metadata_namespace(),
      GetArenaNoVirtual());
  }
  ruby_package_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_ruby_package()) {
    ruby_package_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_ruby_package(),
      GetArenaNoVirtual());
  }
  ::memcpy(&java_multiple_files_, &from.java_multiple_files_,
    static_cast<size_t>(reinterpret_cast<char*>(&optimize_for_) -
    reinterpret_cast<char*>(&java_multiple_files_)) + sizeof(optimize_for_));
  // @@protoc_insertion_point(copy_constructor:google.protobuf.FileOptions)
}